

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InterfacePortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InterfacePortHeaderSyntax,slang::parsing::Token&,slang::syntax::DotMemberClauseSyntax*&>
          (BumpAllocator *this,Token *args,DotMemberClauseSyntax **args_1)

{
  Token nameOrKeyword;
  InterfacePortHeaderSyntax *this_00;
  DotMemberClauseSyntax **args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (InterfacePortHeaderSyntax *)allocate(this,0x28,8);
  nameOrKeyword.kind = args->kind;
  nameOrKeyword._2_1_ = args->field_0x2;
  nameOrKeyword.numFlags.raw = (args->numFlags).raw;
  nameOrKeyword.rawLen = args->rawLen;
  nameOrKeyword.info = args->info;
  slang::syntax::InterfacePortHeaderSyntax::InterfacePortHeaderSyntax(this_00,nameOrKeyword,*args_1)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }